

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  undefined1 local_58 [8];
  mbedtls_pem_context pem;
  size_t len;
  uchar *p;
  uchar *puStack_28;
  int ret;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context *ctx_local;
  
  puStack_28 = (uchar *)keylen;
  keylen_local = (size_t)key;
  key_local = (uchar *)ctx;
  mbedtls_pem_init((mbedtls_pem_context *)local_58);
  if ((puStack_28 == (uchar *)0x0) || (puStack_28[keylen_local - 1] != '\0')) {
    p._4_4_ = -0x1080;
  }
  else {
    p._4_4_ = mbedtls_pem_read_buffer
                        ((mbedtls_pem_context *)local_58,"-----BEGIN PUBLIC KEY-----",
                         "-----END PUBLIC KEY-----",(uchar *)keylen_local,(uchar *)0x0,0,
                         (size_t *)&pem.info);
  }
  if (p._4_4_ == 0) {
    keylen_local = (size_t)local_58;
    puStack_28 = pem.buf;
  }
  else if (p._4_4_ != -0x1080) {
    mbedtls_pem_free((mbedtls_pem_context *)local_58);
    return p._4_4_;
  }
  len = keylen_local;
  p._4_4_ = mbedtls_pk_parse_subpubkey
                      ((uchar **)&len,puStack_28 + keylen_local,(mbedtls_pk_context *)key_local);
  mbedtls_pem_free((mbedtls_pem_context *)local_58);
  return p._4_4_;
}

Assistant:

int mbedtls_pk_parse_public_key( mbedtls_pk_context *ctx,
                         const unsigned char *key, size_t keylen )
{
    int ret;
    unsigned char *p;
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;

    mbedtls_pem_init( &pem );

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( keylen == 0 || key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                "-----BEGIN PUBLIC KEY-----",
                "-----END PUBLIC KEY-----",
                key, NULL, 0, &len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        key = pem.buf;
        keylen = pem.buflen;
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
#endif /* MBEDTLS_PEM_PARSE_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey( &p, p + keylen, ctx );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_free( &pem );
#endif

    return( ret );
}